

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O3

void __thiscall
fasttext::Dictionary::pushHash
          (Dictionary *this,vector<int,_std::allocator<int>_> *hashes,int32_t id)

{
  vector<int,_std::allocator<int>_> *this_00;
  pointer piVar1;
  size_t __n;
  int iVar2;
  const_iterator cVar3;
  long *plVar4;
  size_type *psVar5;
  iterator iVar6;
  char *this_01;
  long lVar7;
  pointer peVar8;
  ulong uVar9;
  string sStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  vector<int,_std::allocator<int>_> *pvStack_58;
  int32_t local_20;
  int local_1c;
  
  if (-1 < id && this->pruneidx_size_ != 0) {
    local_20 = id;
    if (0 < this->pruneidx_size_) {
      cVar3 = std::
              _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->pruneidx_)._M_h,&local_20);
      if (cVar3.super__Node_iterator_base<std::pair<const_int,_int>,_false>._M_cur ==
          (__node_type *)0x0) {
        return;
      }
      cVar3 = std::
              _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->pruneidx_)._M_h,&local_20);
      if (cVar3.super__Node_iterator_base<std::pair<const_int,_int>,_false>._M_cur ==
          (__node_type *)0x0) {
        this_01 = "_Map_base::at";
        std::__throw_out_of_range("_Map_base::at");
        if (((Dictionary *)this_01)->size_ != 0) {
          lVar7 = 0x30;
          uVar9 = 0;
          pvStack_58 = hashes;
          do {
            std::operator+(&bStack_78,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           BOW_abi_cxx11_,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)(((Dictionary *)this_01)->words_).
                                  super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar7 + -0x30));
            plVar4 = (long *)std::__cxx11::string::_M_append((char *)&bStack_78,EOW_abi_cxx11_);
            psVar5 = (size_type *)(plVar4 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar4 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar5) {
              sStack_98.field_2._M_allocated_capacity = *psVar5;
              sStack_98.field_2._8_8_ = plVar4[3];
              sStack_98._M_dataplus._M_p = (pointer)&sStack_98.field_2;
            }
            else {
              sStack_98.field_2._M_allocated_capacity = *psVar5;
              sStack_98._M_dataplus._M_p = (pointer)*plVar4;
            }
            sStack_98._M_string_length = plVar4[1];
            *plVar4 = (long)psVar5;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(bStack_78._M_dataplus._M_p._4_4_,(int)bStack_78._M_dataplus._M_p) !=
                &bStack_78.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(bStack_78._M_dataplus._M_p._4_4_,
                                       (int)bStack_78._M_dataplus._M_p));
            }
            peVar8 = (((Dictionary *)this_01)->words_).
                     super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>._M_impl.
                     super__Vector_impl_data._M_start;
            this_00 = (vector<int,_std::allocator<int>_> *)
                      ((long)&(peVar8->word)._M_dataplus._M_p + lVar7);
            piVar1 = *(pointer *)((long)&(peVar8->word)._M_dataplus._M_p + lVar7);
            iVar6._M_current = *(int **)((long)&(peVar8->word)._M_string_length + lVar7);
            if (iVar6._M_current != piVar1) {
              (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish = piVar1;
              iVar6._M_current = piVar1;
            }
            bStack_78._M_dataplus._M_p._0_4_ = (int)uVar9;
            if (iVar6._M_current == *(int **)((long)&(peVar8->word).field_2 + lVar7)) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (this_00,iVar6,(int *)&bStack_78);
              peVar8 = (((Dictionary *)this_01)->words_).
                       super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>._M_impl
                       .super__Vector_impl_data._M_start;
            }
            else {
              *iVar6._M_current = (int)bStack_78._M_dataplus._M_p;
              (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish = iVar6._M_current + 1;
            }
            __n = *(size_t *)((long)peVar8 + lVar7 + -0x28);
            if ((__n != DAT_00130358) ||
               ((__n != 0 &&
                (iVar2 = bcmp(*(void **)((long)peVar8 + lVar7 + -0x30),EOS_abi_cxx11_,__n),
                iVar2 != 0)))) {
              computeSubwords((Dictionary *)this_01,&sStack_98,
                              (vector<int,_std::allocator<int>_> *)
                              ((long)&(peVar8->word)._M_dataplus._M_p + lVar7),
                              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)0x0);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)sStack_98._M_dataplus._M_p != &sStack_98.field_2) {
              operator_delete(sStack_98._M_dataplus._M_p);
            }
            uVar9 = uVar9 + 1;
            lVar7 = lVar7 + 0x48;
          } while (uVar9 < (ulong)(long)((Dictionary *)this_01)->size_);
        }
        return;
      }
      local_20 = *(int *)((long)cVar3.super__Node_iterator_base<std::pair<const_int,_int>,_false>.
                                _M_cur + 0xc);
    }
    local_1c = local_20 + this->nwords_;
    iVar6._M_current =
         (hashes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar6._M_current ==
        (hashes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(hashes,iVar6,&local_1c);
    }
    else {
      *iVar6._M_current = local_1c;
      (hashes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = iVar6._M_current + 1;
    }
  }
  return;
}

Assistant:

void Dictionary::pushHash(std::vector<int32_t>& hashes, int32_t id) const {
  if (pruneidx_size_ == 0 || id < 0) return;
  if (pruneidx_size_ > 0) {
    if (pruneidx_.count(id)) {
      id = pruneidx_.at(id);
    } else {
      return;
    }
  }
  hashes.push_back(nwords_ + id);
}